

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<burst::semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>,std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_List_iterator<int>,std::_Deque_iterator<int,int&,int*>>>>>>,std::less<void>>>,std::initializer_list<int>>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<burst::semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::less<void>_>_>
          *lhs,char *op,initializer_list<int> *rhs)

{
  ostream *Os;
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  Os = tlssPush();
  boost::operator<<(Os,(iterator_range<burst::semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_List_iterator<int>,_std::_Deque_iterator<int,_int_&,_int_*>_>_>_>_>_>,_std::less<void>_>_>
                        *)this);
  tlssPop();
  String::String(&local_60,(char *)lhs);
  operator+(&local_30,&local_48,&local_60);
  String::String(&SStack_78,"{?}");
  operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }